

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O0

void __thiscall cpp_sgr::sgr::~sgr(sgr *this)

{
  sgr *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~sgr() = default;